

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_wrapper.hpp
# Opt level: O3

PyObject *
boost::python::objects::
class_cref_wrapper<StimulationCommand,_boost::python::objects::make_instance<StimulationCommand,_boost::python::objects::value_holder<StimulationCommand>_>_>
::convert(StimulationCommand *x)

{
  Py_ssize_t PVar1;
  PyTypeObject *pPVar2;
  Py_ssize_t PVar3;
  PyTypeObject *pPVar4;
  Py_ssize_t PVar5;
  PyTypeObject *pPVar6;
  Py_ssize_t PVar7;
  long lVar8;
  _object *p_Var9;
  decref_guard protect;
  decref_guard local_20;
  
  lVar8 = converter::registration::get_class_object
                    (converter::detail::registered_base<StimulationCommand_const_volatile&>::
                     converters);
  if (lVar8 == 0) {
    p_Var9 = (_object *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  else {
    p_Var9 = (_object *)(**(code **)(lVar8 + 0x130))(lVar8,0x58);
    if (p_Var9 == (_object *)0x0) {
      p_Var9 = (_object *)0x0;
    }
    else {
      local_20.obj = p_Var9;
      instance_holder::instance_holder((instance_holder *)(p_Var9 + 3));
      p_Var9[3].ob_refcnt = (Py_ssize_t)&PTR__value_holder_003eca68;
      p_Var9[4].ob_refcnt = (Py_ssize_t)&PTR__NetworkDataType_003ec178;
      PVar1 = *(Py_ssize_t *)&x->_startPhaseTwoMark;
      pPVar2 = *(PyTypeObject **)&x->_chargeRecoveryOnMark;
      PVar3 = *(Py_ssize_t *)&x->_endMark;
      pPVar4 = *(PyTypeObject **)&x->secondPulseAmplitude;
      PVar5 = *(Py_ssize_t *)&x->preSettle_Samples;
      pPVar6 = *(PyTypeObject **)&x->chargeRecoveryLength_Samples;
      PVar7 = *(Py_ssize_t *)&x->cathodeNtrodeID;
      p_Var9[4].ob_type = *(PyTypeObject **)&x->_group;
      p_Var9[5].ob_refcnt = PVar1;
      p_Var9[5].ob_type = pPVar2;
      p_Var9[6].ob_refcnt = PVar3;
      p_Var9[6].ob_type = pPVar4;
      p_Var9[7].ob_refcnt = PVar5;
      p_Var9[7].ob_type = pPVar6;
      p_Var9[8].ob_refcnt = PVar7;
      instance_holder::install((instance_holder *)(p_Var9 + 3),p_Var9);
      p_Var9[1].ob_refcnt = 0x30;
      local_20.obj = (PyObject *)0x0;
      python::detail::decref_guard::~decref_guard(&local_20);
    }
  }
  return p_Var9;
}

Assistant:

static PyObject* convert(Src const& x)
    {
        return MakeInstance::execute(boost::ref(x));
    }